

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O1

void __thiscall
sliding_puzzle::SlidingPuzzle::SlidingPuzzle(SlidingPuzzle *this,int size,int anchor)

{
  pointer *ppaVar1;
  undefined4 *puVar2;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  pointer paVar5;
  undefined4 uVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  undefined4 uVar11;
  bool bVar12;
  int iVar13;
  time_t tVar14;
  ulong uVar15;
  int *__src;
  long lVar16;
  int i;
  int iVar17;
  int j;
  long lVar18;
  long lVar19;
  vector<int,_std::allocator<int>_> start_tiles;
  int local_5c;
  array<double,_3UL> local_58;
  double local_38;
  
  (this->explored_)._M_h._M_buckets = &(this->explored_)._M_h._M_single_bucket;
  (this->explored_)._M_h._M_bucket_count = 1;
  (this->explored_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->explored_)._M_h._M_element_count = 0;
  (this->explored_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->explored_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->explored_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (SlidingPuzzle(int,int)::seed_once == '\0') {
    SlidingPuzzle(int,int)::seed_once = '\x01';
    tVar14 = time((time_t *)0x0);
    srand((uint)tVar14);
  }
  hash_time = 0;
  puzzle_size = size;
  puzzle_anchor = anchor;
  this->num_inadmissible_heuristic_ = 4;
  this->heuristic_weight_range_[0] = 1.0;
  this->heuristic_weight_range_[1] = 5.0;
  iVar17 = 0;
  do {
    lVar18 = 0;
    do {
      local_38 = this->heuristic_weight_range_[0];
      iVar13 = rand();
      local_58._M_elems[lVar18] =
           (double)iVar13 /
           (2147483647.0 / (this->heuristic_weight_range_[1] - this->heuristic_weight_range_[0])) +
           local_38;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    __position._M_current =
         (this->heuristic_weight_).
         super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->heuristic_weight_).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
      _M_realloc_insert<std::array<double,3ul>const&>
                ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)
                 &this->heuristic_weight_,__position,&local_58);
    }
    else {
      (__position._M_current)->_M_elems[2] = local_58._M_elems[2];
      (__position._M_current)->_M_elems[0] = local_58._M_elems[0];
      (__position._M_current)->_M_elems[1] = local_58._M_elems[1];
      ppaVar1 = &(this->heuristic_weight_).
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 < this->num_inadmissible_heuristic_);
  local_58._M_elems[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58._M_elems + 1),
             (SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_5c);
  dVar10 = local_58._M_elems[1];
  dVar7 = local_58._M_elems[0];
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  p_Var3 = (this->start_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)dVar7;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1]);
  }
  local_58._M_elems[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58._M_elems + 1),
             (SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_5c);
  uVar6 = local_58._M_elems[0]._0_4_;
  uVar8 = local_58._M_elems[0]._4_4_;
  uVar9 = local_58._M_elems[1]._0_4_;
  uVar11 = local_58._M_elems[1]._4_4_;
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  p_Var3 = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  *(undefined4 *)
   &(this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = uVar6;
  *(undefined4 *)
   ((long)&(this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 4) = uVar8;
  *(undefined4 *)
   &(this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = uVar9;
  *(undefined4 *)
   ((long)&(this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar11;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1]);
  }
  if (0 < (int)puzzle_size) {
    peVar4 = (this->goal_).
             super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar17 = 1;
    lVar18 = 0;
    do {
      uVar15 = (ulong)puzzle_size;
      if (0 < (int)puzzle_size) {
        lVar19 = *(long *)((long)(peVar4->state_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18);
        lVar16 = 0;
        do {
          *(int *)(lVar19 + lVar16 * 4) =
               (iVar17 + (int)lVar16) % (int)((double)(int)uVar15 * (double)(int)uVar15);
          lVar16 = lVar16 + 1;
          uVar15 = (ulong)(int)puzzle_size;
        } while (lVar16 < (long)uVar15);
        iVar17 = iVar17 + (int)lVar16;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)puzzle_size);
  }
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  local_58._M_elems[2] = 0.0;
  local_5c = 0;
  if (puzzle_size != 0) {
    do {
      if (local_58._M_elems[1] == local_58._M_elems[2]) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,(iterator)local_58._M_elems[1],
                   &local_5c);
      }
      else {
        *(int *)local_58._M_elems[1] = local_5c;
        local_58._M_elems[1] = (double)((long)local_58._M_elems[1] + 4);
      }
      local_5c = local_5c + 1;
    } while (local_5c < (int)(puzzle_size * puzzle_size));
  }
  if (0 < (int)puzzle_size) {
    lVar18 = 0;
    do {
      if (0 < (int)puzzle_size) {
        lVar19 = 0;
        do {
          iVar17 = rand();
          lVar16 = (long)(int)((ulong)(long)iVar17 %
                              (ulong)((long)local_58._M_elems[1] - (long)local_58._M_elems[0] >> 2))
          ;
          puVar2 = (undefined4 *)((long)local_58._M_elems[0] + lVar16 * 4);
          __src = puVar2 + 1;
          *(undefined4 *)
           (*(long *)((long)(((this->start_).
                              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->state_).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18) + lVar19 * 4)
               = *puVar2;
          if (__src != (int *)local_58._M_elems[1]) {
            memmove((void *)((long)local_58._M_elems[0] + lVar16 * 4),__src,
                    (long)local_58._M_elems[1] - (long)__src);
          }
          local_58._M_elems[1] = (double)((long)local_58._M_elems[1] + -4);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)puzzle_size);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)puzzle_size);
  }
  bVar12 = generateSolvableStartState(this,0x2ee);
  if ((void *)local_58._M_elems[0] != (void *)0x0) {
    operator_delete((void *)local_58._M_elems[0],
                    (long)local_58._M_elems[2] - (long)local_58._M_elems[0]);
  }
  paVar5 = (this->heuristic_weight_).
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->heuristic_weight_).
                                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  p_Var3 = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->start_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  _Unwind_Resume(bVar12);
}

Assistant:

SlidingPuzzle::SlidingPuzzle(int size, int anchor)
{
  static bool seed_once = true;
  if (seed_once)
  {
    seed_once = false;
    srand(time(NULL));
  }
  
  puzzle_size = size;
  puzzle_anchor = anchor;
  
  hash_time = 0;
  
  // Multi heuristic params
  num_inadmissible_heuristic_ = 4;
  heuristic_weight_range_[0] = 1.0;
  heuristic_weight_range_[1] = 5.0;
  for (int i=0; i<num_inadmissible_heuristic_; ++i)
  {
    std::array<double,3> weight;
    for (int j=0; j<3; ++j)
    {
      weight[j] = heuristic_weight_range_[0] +
        static_cast<double>(rand())/
          (RAND_MAX/(heuristic_weight_range_[1]-heuristic_weight_range_[0]));
    }
    heuristic_weight_.push_back(weight);
  }
  
  start_ = std::make_shared<SlidingPuzzleState>();
  goal_ = std::make_shared<SlidingPuzzleState>();
  int value = 1;
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      goal_->state_[i][j] = value % static_cast<int>(pow(puzzle_size,2));
      ++value;
    }
  }

  // Random start state
  std::vector<int> start_tiles;
  for (int i=0; i<puzzle_size*puzzle_size; ++i)
  {
    start_tiles.push_back(i);
  }
  
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      int index = rand() % start_tiles.size();
      start_->state_[i][j] = start_tiles[index];
      start_tiles.erase(start_tiles.begin()+index);
    }
  }

  generateSolvableStartState(750);

  std::cout << "The random start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}